

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O0

void __thiscall
FIX::DataDictionary::checkHasRequired
          (DataDictionary *this,FieldMap *header,FieldMap *body,FieldMap *trailer,MsgType *msgType)

{
  int iVar1;
  FieldMap *header_00;
  FieldMap *body_00;
  DataDictionary *this_00;
  bool bVar2;
  pointer ppVar3;
  string *psVar4;
  pointer ppVar5;
  reference piVar6;
  RequiredTagMissing *pRVar7;
  pointer ppVar8;
  reference ppFVar9;
  __normal_iterator<FIX::FieldMap_*const_*,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
  local_158;
  FieldMap **local_150;
  __normal_iterator<FIX::FieldMap_*const_*,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
  local_148;
  const_iterator group;
  DataDictionary *pDStack_138;
  int field;
  DataDictionary *DD;
  g_const_iterator gStack_128;
  int delim;
  _Base_ptr local_120;
  _Rb_tree_const_iterator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>
  local_118;
  g_const_iterator groups;
  string local_108;
  _Self local_e8;
  _Base_ptr local_e0;
  _Rb_tree_const_iterator<int> local_d8;
  const_iterator iF;
  MsgFields *fields;
  _Self local_c0;
  const_iterator iM;
  string local_b0;
  _Self local_90;
  _Base_ptr local_88;
  undefined1 local_7d;
  allocator<char> local_69;
  string local_68;
  _Self local_48;
  _Base_ptr local_40;
  _Rb_tree_const_iterator<std::pair<const_int,_bool>_> local_38;
  const_iterator iNBF;
  MsgType *msgType_local;
  FieldMap *trailer_local;
  FieldMap *body_local;
  FieldMap *header_local;
  DataDictionary *this_local;
  
  iNBF._M_node = (_Base_ptr)msgType;
  std::_Rb_tree_const_iterator<std::pair<const_int,_bool>_>::_Rb_tree_const_iterator(&local_38);
  local_40 = (_Base_ptr)
             std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
             begin(&this->m_headerFields);
  local_38._M_node = local_40;
  do {
    local_48._M_node =
         (_Base_ptr)
         std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::end
                   (&this->m_headerFields);
    bVar2 = std::operator!=(&local_38,&local_48);
    if (!bVar2) {
      local_88 = (_Base_ptr)
                 std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
                 begin(&this->m_trailerFields);
      local_38._M_node = local_88;
      do {
        local_90._M_node =
             (_Base_ptr)
             std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::end
                       (&this->m_trailerFields);
        bVar2 = std::operator!=(&local_38,&local_90);
        if (!bVar2) {
          psVar4 = FieldBase::getString_abi_cxx11_((FieldBase *)iNBF._M_node);
          local_c0._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
               ::find(&this->m_requiredFields,psVar4);
          fields = (MsgFields *)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                   ::end(&this->m_requiredFields);
          bVar2 = std::operator==(&local_c0,(_Self *)&fields);
          if (!bVar2) {
            ppVar5 = std::
                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                     ::operator->(&local_c0);
            iF._M_node = (_Base_ptr)&ppVar5->second;
            std::_Rb_tree_const_iterator<int>::_Rb_tree_const_iterator(&local_d8);
            local_e0 = (_Base_ptr)
                       std::set<int,_std::less<int>,_std::allocator<int>_>::begin(iF._M_node);
            local_d8._M_node = local_e0;
            while( true ) {
              local_e8._M_node =
                   (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::end(iF._M_node);
              bVar2 = std::operator!=(&local_d8,&local_e8);
              if (!bVar2) break;
              piVar6 = std::_Rb_tree_const_iterator<int>::operator*(&local_d8);
              bVar2 = FieldMap::isSetField(body,*piVar6);
              if (!bVar2) {
                groups._M_node._6_1_ = 1;
                pRVar7 = (RequiredTagMissing *)__cxa_allocate_exception(0x58);
                piVar6 = std::_Rb_tree_const_iterator<int>::operator*(&local_d8);
                iVar1 = *piVar6;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_108,"",(allocator<char> *)((long)&groups._M_node + 7));
                RequiredTagMissing::RequiredTagMissing(pRVar7,iVar1,&local_108);
                groups._M_node._6_1_ = 0;
                __cxa_throw(pRVar7,&RequiredTagMissing::typeinfo,
                            RequiredTagMissing::~RequiredTagMissing);
              }
              std::_Rb_tree_const_iterator<int>::operator++(&local_d8);
            }
            std::
            _Rb_tree_const_iterator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>
            ::_Rb_tree_const_iterator(&local_118);
            local_120 = (_Base_ptr)FieldMap::g_begin(body);
            local_118._M_node = local_120;
            while( true ) {
              gStack_128 = FieldMap::g_end(body);
              bVar2 = std::operator!=(&local_118,&stack0xfffffffffffffed8);
              if (!bVar2) break;
              pDStack_138 = (DataDictionary *)0x0;
              ppVar8 = std::
                       _Rb_tree_const_iterator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>
                       ::operator->(&local_118);
              group._M_current._4_4_ = ppVar8->first;
              psVar4 = StringField::getValue_abi_cxx11_((StringField *)iNBF._M_node);
              bVar2 = getGroup(this,psVar4,group._M_current._4_4_,(int *)((long)&DD + 4),
                               &stack0xfffffffffffffec8);
              if (bVar2) {
                __gnu_cxx::
                __normal_iterator<FIX::FieldMap_*const_*,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
                ::__normal_iterator(&local_148);
                ppVar8 = std::
                         _Rb_tree_const_iterator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>
                         ::operator->(&local_118);
                local_150 = (FieldMap **)
                            std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>::begin
                                      (&ppVar8->second);
                local_148._M_current = local_150;
                while( true ) {
                  ppVar8 = std::
                           _Rb_tree_const_iterator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>
                           ::operator->(&local_118);
                  local_158._M_current =
                       (FieldMap **)
                       std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>::end
                                 (&ppVar8->second);
                  bVar2 = __gnu_cxx::operator!=(&local_148,&local_158);
                  this_00 = pDStack_138;
                  if (!bVar2) break;
                  ppFVar9 = __gnu_cxx::
                            __normal_iterator<FIX::FieldMap_*const_*,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
                            ::operator*(&local_148);
                  header_00 = *ppFVar9;
                  ppFVar9 = __gnu_cxx::
                            __normal_iterator<FIX::FieldMap_*const_*,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
                            ::operator*(&local_148);
                  body_00 = *ppFVar9;
                  ppFVar9 = __gnu_cxx::
                            __normal_iterator<FIX::FieldMap_*const_*,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
                            ::operator*(&local_148);
                  checkHasRequired(this_00,header_00,body_00,*ppFVar9,(MsgType *)iNBF._M_node);
                  __gnu_cxx::
                  __normal_iterator<FIX::FieldMap_*const_*,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
                  ::operator++(&local_148);
                }
              }
              std::
              _Rb_tree_const_iterator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>
              ::operator++(&local_118);
            }
          }
          return;
        }
        ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_int,_bool>_>::operator->(&local_38);
        if ((ppVar3->second & 1U) == 1) {
          ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_int,_bool>_>::operator->(&local_38);
          bVar2 = FieldMap::isSetField(trailer,ppVar3->first);
          if (!bVar2) {
            iM._M_node._6_1_ = 1;
            pRVar7 = (RequiredTagMissing *)__cxa_allocate_exception(0x58);
            ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_int,_bool>_>::operator->
                               (&local_38);
            iVar1 = ppVar3->first;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_b0,"",(allocator<char> *)((long)&iM._M_node + 7));
            RequiredTagMissing::RequiredTagMissing(pRVar7,iVar1,&local_b0);
            iM._M_node._6_1_ = 0;
            __cxa_throw(pRVar7,&RequiredTagMissing::typeinfo,RequiredTagMissing::~RequiredTagMissing
                       );
          }
        }
        std::_Rb_tree_const_iterator<std::pair<const_int,_bool>_>::operator++(&local_38);
      } while( true );
    }
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_int,_bool>_>::operator->(&local_38);
    if ((ppVar3->second & 1U) == 1) {
      ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_int,_bool>_>::operator->(&local_38);
      bVar2 = FieldMap::isSetField(header,ppVar3->first);
      if (!bVar2) {
        local_7d = 1;
        pRVar7 = (RequiredTagMissing *)__cxa_allocate_exception(0x58);
        ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_int,_bool>_>::operator->(&local_38);
        iVar1 = ppVar3->first;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"",&local_69);
        RequiredTagMissing::RequiredTagMissing(pRVar7,iVar1,&local_68);
        local_7d = 0;
        __cxa_throw(pRVar7,&RequiredTagMissing::typeinfo,RequiredTagMissing::~RequiredTagMissing);
      }
    }
    std::_Rb_tree_const_iterator<std::pair<const_int,_bool>_>::operator++(&local_38);
  } while( true );
}

Assistant:

void checkHasRequired
  ( const FieldMap& header, const FieldMap& body, const FieldMap& trailer,
    const MsgType& msgType ) const
  EXCEPT ( RequiredTagMissing )
  {
    NonBodyFields::const_iterator iNBF;
    for( iNBF = m_headerFields.begin(); iNBF != m_headerFields.end(); ++iNBF )
    {
      if( iNBF->second == true && !header.isSetField(iNBF->first) )
        throw RequiredTagMissing( iNBF->first );
    }

    for( iNBF = m_trailerFields.begin(); iNBF != m_trailerFields.end(); ++iNBF )
    {
      if( iNBF->second == true && !trailer.isSetField(iNBF->first) )
        throw RequiredTagMissing( iNBF->first );
    }

    MsgTypeToField::const_iterator iM
      = m_requiredFields.find( msgType.getString() );
    if ( iM == m_requiredFields.end() ) return ;

    const MsgFields& fields = iM->second;
    MsgFields::const_iterator iF;
    for( iF = fields.begin(); iF != fields.end(); ++iF )
    {
      if( !body.isSetField(*iF) )
        throw RequiredTagMissing( *iF );
    }

    FieldMap::g_const_iterator groups;
    for( groups = body.g_begin(); groups != body.g_end(); ++groups )
    {
      int delim;
      const DataDictionary* DD = 0;
      int field = groups->first;
      if( getGroup( msgType.getValue(), field, delim, DD ) )
      {
        std::vector<FieldMap*>::const_iterator group;
        for( group = groups->second.begin(); group != groups->second.end(); ++group )
          DD->checkHasRequired( **group, **group, **group, msgType );
      }
    }
  }